

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizard::done(QWizard *this,int result)

{
  ulong uVar1;
  int in_ESI;
  QWizardPrivate *in_RDI;
  QWizardPrivate *d;
  QWizardPrivate *this_00;
  
  this_00 = in_RDI;
  d_func((QWizard *)0x7bc8f0);
  if (in_ESI == 0) {
    QWizardPrivate::reset(this_00);
  }
  else {
    uVar1 = (**(code **)(*(long *)&(in_RDI->super_QDialogPrivate).super_QWidgetPrivate + 0x1c8))();
    if ((uVar1 & 1) == 0) {
      return;
    }
  }
  QDialog::done((QDialog *)this_00,in_ESI);
  return;
}

Assistant:

void QWizard::done(int result)
{
    Q_D(QWizard);
    // canceling leaves the wizard in a known state
    if (result == Rejected) {
        d->reset();
    } else {
        if (!validateCurrentPage())
            return;
    }
    QDialog::done(result);
}